

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void verify_db(storage_t *st)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  checkpoint_t *pcVar7;
  checkpoint_t *__ptr;
  timeval __test_begin;
  fdb_kvs_info info;
  char rbuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  __ptr = create_checkpoint(st,6);
  pcVar7 = st->v_chk;
  uVar1 = pcVar7->ndocs;
  uVar2 = pcVar7->num_indexed;
  uVar3 = __ptr->ndocs;
  uVar4 = __ptr->num_indexed;
  uVar5 = __ptr->sum_age_indexed;
  uVar6 = pcVar7->sum_age_indexed;
  e2e_fdb_commit(st->main,st->walflush);
  fdb_get_kvs_info(st->index1,&info);
  free(__ptr);
  sprintf(rbuf,"[%s] verifydb: ndocs(%d=%d), nidx(%d=%d), sumage(%d=%d)\n",st->keyspace,(ulong)uVar3
          ,(ulong)uVar1,(ulong)uVar4,(ulong)uVar2,(ulong)uVar5,(ulong)uVar6);
  return;
}

Assistant:

void verify_db(storage_t *st) {

    TEST_INIT();

    checkpoint_t *db_checkpoint = create_checkpoint(st, END_CHECKPOINT);
    int db_ndocs = db_checkpoint->ndocs;
    int exp_ndocs = st->v_chk->ndocs;
    int exp_nidx = st->v_chk->num_indexed;
    int db_nidx = db_checkpoint->num_indexed;
    int db_suma = db_checkpoint->sum_age_indexed;
    int exp_suma = st->v_chk->sum_age_indexed;
    fdb_kvs_info info;
    char rbuf[256];

    e2e_fdb_commit(st->main, st->walflush);

    fdb_get_kvs_info(st->index1, &info);

#ifdef __DEBUG_E2E
    int val1, val2;
    fdb_iterator *it;
    fdb_doc *rdoc = NULL;
    if (db_ndocs != exp_ndocs) {
        // for debugging: currently inaccurate for concurrency patterns
        fdb_get_kvs_info(st->all_docs, &info);
        val1 = info.doc_count;
        (void)val1;
        val2 = 0;
        fdb_iterator_init(st->index1, &it, NULL, 0,
                          NULL, 0, FDB_ITR_NONE);
        do {
            fdb_iterator_get(it, &rdoc);
            if (!rdoc->deleted) {
                val2++;
            }
            fdb_doc_free(rdoc);
            rdoc=NULL;
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
        printf("ndocs_debug: kvs_info(%d) == exp_ndocs(%d) ?\n", val1,exp_ndocs);
        printf("ndocs_debug: kvs_info(%d) == itr_count(%d) ?\n", val1, val2);
        fdb_iterator_close(it);
    }
    printf("[%s] db_ndix(%d) == exp_nidx(%d)\n", st->keyspace, db_nidx, exp_nidx);
#endif

    free(db_checkpoint);
    db_checkpoint=NULL;
    //TEST_CHK(db_nidx==exp_nidx);
    //TEST_CHK(db_suma==exp_suma);

    sprintf(rbuf, "[%s] verifydb: ndocs(%d=%d), nidx(%d=%d), sumage(%d=%d)\n",
            st->keyspace,
            db_ndocs, exp_ndocs,
            db_nidx, exp_nidx,
            db_suma, exp_suma);
#ifdef __DEBUG_E2E
    TEST_RESULT(rbuf);
#endif
}